

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_46569::DepsLogTestRecompact::Run(DepsLogTestRecompact *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  LoadStatus LVar5;
  vector<Node_*,_std::allocator<Node_*>_> *pvVar6;
  const_reference ppNVar7;
  string *psVar8;
  Node *pNVar9;
  undefined1 local_ba0 [4];
  int file_size_4;
  stat st_3;
  StringPiece local_b00;
  allocator<char> local_ae9;
  string local_ae8;
  StringPiece local_ac8;
  Node *local_ab8;
  Node *other_out_1;
  Deps *deps_3;
  Node *local_a98;
  Node *out_1;
  string local_a88;
  undefined1 local_a68 [8];
  string err_3;
  DepsLog log_3;
  State state_3;
  stat st_2;
  string local_848;
  StringPiece local_828;
  Node *local_818;
  Node *other_out;
  Deps *deps_2;
  Node *local_7f8;
  Node *out;
  string local_7e8;
  undefined1 local_7c8 [8];
  string err_2;
  DepsLog log_2;
  undefined1 local_738 [4];
  int fail_count_2;
  State state_2;
  undefined1 local_628 [4];
  int file_size_3;
  stat st_1;
  StringPiece local_588;
  Node *local_578;
  undefined1 local_570 [8];
  vector<Node_*,_std::allocator<Node_*>_> deps_1;
  string local_550;
  allocator<char> local_529;
  string local_528;
  undefined1 local_508 [8];
  string err_1;
  DepsLog log_1;
  undefined1 local_478 [4];
  int fail_count_1;
  State state_1;
  undefined1 local_368 [4];
  int file_size_2;
  stat st;
  StringPiece local_2c8;
  Node *local_2b8;
  StringPiece local_2b0;
  Node *local_2a0;
  StringPiece local_298;
  StringPiece local_288;
  Node *local_278;
  StringPiece local_270;
  Node *local_260;
  undefined1 local_258 [8];
  vector<Node_*,_std::allocator<Node_*>_> deps;
  string local_238;
  undefined1 local_218 [8];
  string err;
  DepsLog log;
  undefined1 local_178 [4];
  int fail_count;
  State state;
  char acStack_68 [4];
  int file_size;
  char kManifest [75];
  DepsLogTestRecompact *this_local;
  
  builtin_strncpy(kManifest + 0x38,"out.o: cc\n",0xb);
  builtin_strncpy(kManifest + 0x28," cc\nbuild other_",0x10);
  builtin_strncpy(kManifest + 0x18,"gcc\nbuild out.o:",0x10);
  builtin_strncpy(kManifest + 8,"d = cc\n  deps = ",0x10);
  builtin_strncpy(acStack_68,"rule",4);
  file_size._0_1_ = ' ';
  file_size._1_1_ = 'c';
  file_size._2_1_ = 'c';
  file_size._3_1_ = '\n';
  builtin_strncpy(kManifest,"  comman",8);
  State::State((State *)local_178);
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions
            ((ManifestParserOptions *)
             ((long)&log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  AssertParse((State *)local_178,acStack_68,stack0xfffffffffffffe6c);
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 == iVar4) {
    DepsLog::DepsLog((DepsLog *)((long)&err.field_2 + 8));
    std::__cxx11::string::string((string *)local_218);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"DepsLogTest-tempfile",
               (allocator<char> *)
               ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar2 = DepsLog::OpenForWrite
                      ((DepsLog *)((long)&err.field_2 + 8),&local_238,(string *)local_218);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0xbb,"log.OpenForWrite(kTestFilename, &err)");
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&deps.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    pTVar1 = g_current_test;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_218);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xbc,"\"\" == err");
      if (bVar2) {
        std::vector<Node_*,_std::allocator<Node_*>_>::vector
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_258);
        StringPiece::StringPiece(&local_270,"foo.h");
        local_260 = State::GetNode((State *)local_178,local_270,0);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_258,&local_260);
        StringPiece::StringPiece(&local_288,"bar.h");
        local_278 = State::GetNode((State *)local_178,local_288,0);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_258,&local_278);
        StringPiece::StringPiece(&local_298,"out.o");
        pNVar9 = State::GetNode((State *)local_178,local_298,0);
        DepsLog::RecordDeps((DepsLog *)((long)&err.field_2 + 8),pNVar9,1,
                            (vector<Node_*,_std::allocator<Node_*>_> *)local_258);
        std::vector<Node_*,_std::allocator<Node_*>_>::clear
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_258);
        StringPiece::StringPiece(&local_2b0,"foo.h");
        local_2a0 = State::GetNode((State *)local_178,local_2b0,0);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_258,&local_2a0);
        StringPiece::StringPiece(&local_2c8,"baz.h");
        local_2b8 = State::GetNode((State *)local_178,local_2c8,0);
        std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_258,&local_2b8);
        StringPiece::StringPiece((StringPiece *)(st.__glibc_reserved + 2),"other_out.o");
        pNVar9 = State::GetNode((State *)local_178,stack0xfffffffffffffd28,0);
        DepsLog::RecordDeps((DepsLog *)((long)&err.field_2 + 8),pNVar9,1,
                            (vector<Node_*,_std::allocator<Node_*>_> *)local_258);
        DepsLog::Close((DepsLog *)((long)&err.field_2 + 8));
        pTVar1 = g_current_test;
        iVar3 = stat("DepsLogTest-tempfile",(stat *)local_368);
        bVar2 = testing::Test::Check
                          (pTVar1,iVar3 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0xcb,"0 == stat(kTestFilename, &st)");
        if (bVar2) {
          state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (int)st.st_rdev;
          bVar2 = testing::Test::Check
                            (g_current_test,0 < (int)st.st_rdev,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0xcd,"file_size > 0");
          if (bVar2) {
            log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_258);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_218);
    DepsLog::~DepsLog((DepsLog *)((long)&err.field_2 + 8));
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  State::~State((State *)local_178);
  if ((int)log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage == 0) {
    State::State((State *)local_478);
    iVar3 = testing::Test::AssertionFailures(g_current_test);
    ManifestParserOptions::ManifestParserOptions
              ((ManifestParserOptions *)
               ((long)&log_1.deps_.
                       super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 4));
    AssertParse((State *)local_478,acStack_68,stack0xfffffffffffffb7c);
    iVar4 = testing::Test::AssertionFailures(g_current_test);
    if (iVar3 == iVar4) {
      DepsLog::DepsLog((DepsLog *)((long)&err_1.field_2 + 8));
      std::__cxx11::string::string((string *)local_508);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"DepsLogTest-tempfile",&local_529);
      LVar5 = DepsLog::Load((DepsLog *)((long)&err_1.field_2 + 8),&local_528,(State *)local_478,
                            (string *)local_508);
      bVar2 = testing::Test::Check
                        (pTVar1,LVar5 != LOAD_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xd7,"log.Load(kTestFilename, &state, &err)");
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator(&local_529);
      pTVar1 = g_current_test;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_550,"DepsLogTest-tempfile",
                   (allocator<char> *)
                   ((long)&deps_1.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        bVar2 = DepsLog::OpenForWrite
                          ((DepsLog *)((long)&err_1.field_2 + 8),&local_550,(string *)local_508);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0xd9,"log.OpenForWrite(kTestFilename, &err)");
        std::__cxx11::string::~string((string *)&local_550);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&deps_1.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        pTVar1 = g_current_test;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_508);
          bVar2 = testing::Test::Check
                            (pTVar1,bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0xda,"\"\" == err");
          if (bVar2) {
            std::vector<Node_*,_std::allocator<Node_*>_>::vector
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_570);
            StringPiece::StringPiece(&local_588,"foo.h");
            local_578 = State::GetNode((State *)local_478,local_588,0);
            std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_570,&local_578);
            StringPiece::StringPiece((StringPiece *)(st_1.__glibc_reserved + 2),"out.o");
            pNVar9 = State::GetNode((State *)local_478,stack0xfffffffffffffa68,0);
            DepsLog::RecordDeps((DepsLog *)((long)&err_1.field_2 + 8),pNVar9,1,
                                (vector<Node_*,_std::allocator<Node_*>_> *)local_570);
            DepsLog::Close((DepsLog *)((long)&err_1.field_2 + 8));
            pTVar1 = g_current_test;
            iVar3 = stat("DepsLogTest-tempfile",(stat *)local_628);
            bVar2 = testing::Test::Check
                              (pTVar1,iVar3 == 0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                               ,0xe2,"0 == stat(kTestFilename, &st)");
            if (bVar2) {
              state_1.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = (int)st_1.st_rdev;
              bVar2 = testing::Test::Check
                                (g_current_test,
                                 state.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
                                 (int)st_1.st_rdev,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                 ,0xe5,"file_size_2 > file_size");
              if (bVar2) {
                log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
            std::vector<Node_*,_std::allocator<Node_*>_>::~vector
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_570);
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_508);
      DepsLog::~DepsLog((DepsLog *)((long)&err_1.field_2 + 8));
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    State::~State((State *)local_478);
    if ((int)log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage == 0) {
      State::State((State *)local_738);
      iVar3 = testing::Test::AssertionFailures(g_current_test);
      ManifestParserOptions::ManifestParserOptions
                ((ManifestParserOptions *)
                 ((long)&log_2.deps_.
                         super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      AssertParse((State *)local_738,acStack_68,stack0xfffffffffffff8bc);
      iVar4 = testing::Test::AssertionFailures(g_current_test);
      if (iVar3 == iVar4) {
        DepsLog::DepsLog((DepsLog *)((long)&err_2.field_2 + 8));
        std::__cxx11::string::string((string *)local_7c8);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7e8,"DepsLogTest-tempfile",(allocator<char> *)((long)&out + 7));
        LVar5 = DepsLog::Load((DepsLog *)((long)&err_2.field_2 + 8),&local_7e8,(State *)local_738,
                              (string *)local_7c8);
        bVar2 = testing::Test::Check
                          (pTVar1,LVar5 != LOAD_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0xf0,"log.Load(kTestFilename, &state, &err)");
        std::__cxx11::string::~string((string *)&local_7e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&out + 7));
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          StringPiece::StringPiece((StringPiece *)&deps_2,"out.o");
          local_7f8 = State::GetNode((State *)local_738,_deps_2,0);
          other_out = (Node *)DepsLog::GetDeps((DepsLog *)((long)&err_2.field_2 + 8),local_7f8);
          bVar2 = testing::Test::Check
                            (g_current_test,other_out != (Node *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0xf4,"deps");
          if (bVar2) {
            bVar2 = testing::Test::Check
                              (g_current_test,*(long *)&other_out->path_ == 1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                               ,0xf5,"1 == deps->mtime");
            if (bVar2) {
              bVar2 = testing::Test::Check
                                (g_current_test,(int)(other_out->path_)._M_string_length == 1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                 ,0xf6,"1 == deps->node_count");
              pTVar1 = g_current_test;
              if (bVar2) {
                psVar8 = Node::path_abi_cxx11_((Node *)**(undefined8 **)&(other_out->path_).field_2)
                ;
                bVar2 = std::operator==("foo.h",psVar8);
                bVar2 = testing::Test::Check
                                  (pTVar1,bVar2,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                   ,0xf7,"\"foo.h\" == deps->nodes[0]->path()");
                if (bVar2) {
                  StringPiece::StringPiece(&local_828,"other_out.o");
                  local_818 = State::GetNode((State *)local_738,local_828,0);
                  other_out = (Node *)DepsLog::GetDeps((DepsLog *)((long)&err_2.field_2 + 8),
                                                       local_818);
                  bVar2 = testing::Test::Check
                                    (g_current_test,other_out != (Node *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                     ,0xfb,"deps");
                  if (bVar2) {
                    bVar2 = testing::Test::Check
                                      (g_current_test,*(long *)&other_out->path_ == 1,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                       ,0xfc,"1 == deps->mtime");
                    if (bVar2) {
                      bVar2 = testing::Test::Check
                                        (g_current_test,
                                         (int)(other_out->path_)._M_string_length == 2,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                         ,0xfd,"2 == deps->node_count");
                      pTVar1 = g_current_test;
                      if (bVar2) {
                        psVar8 = Node::path_abi_cxx11_
                                           ((Node *)**(undefined8 **)&(other_out->path_).field_2);
                        bVar2 = std::operator==("foo.h",psVar8);
                        bVar2 = testing::Test::Check
                                          (pTVar1,bVar2,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                           ,0xfe,"\"foo.h\" == deps->nodes[0]->path()");
                        pTVar1 = g_current_test;
                        if (bVar2) {
                          psVar8 = Node::path_abi_cxx11_
                                             (*(Node **)((other_out->path_).field_2.
                                                         _M_allocated_capacity + 8));
                          bVar2 = std::operator==("baz.h",psVar8);
                          bVar2 = testing::Test::Check
                                            (pTVar1,bVar2,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                             ,0xff,"\"baz.h\" == deps->nodes[1]->path()");
                          pTVar1 = g_current_test;
                          if (bVar2) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_848,"DepsLogTest-tempfile",
                                       (allocator<char> *)((long)st_2.__glibc_reserved + 0x17));
                            bVar2 = DepsLog::Recompact((DepsLog *)((long)&err_2.field_2 + 8),
                                                       &local_848,(string *)local_7c8);
                            bVar2 = testing::Test::Check
                                              (pTVar1,bVar2,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                               ,0x101,"log.Recompact(kTestFilename, &err)");
                            std::__cxx11::string::~string((string *)&local_848);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)((long)st_2.__glibc_reserved + 0x17));
                            if (((bVar2 ^ 0xffU) & 1) == 0) {
                              other_out = (Node *)DepsLog::GetDeps((DepsLog *)
                                                                   ((long)&err_2.field_2 + 8),
                                                                   local_7f8);
                              bVar2 = testing::Test::Check
                                                (g_current_test,other_out != (Node *)0x0,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                 ,0x105,"deps");
                              if (bVar2) {
                                bVar2 = testing::Test::Check
                                                  (g_current_test,*(long *)&other_out->path_ == 1,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x106,"1 == deps->mtime");
                                if (bVar2) {
                                  bVar2 = testing::Test::Check
                                                    (g_current_test,
                                                     (int)(other_out->path_)._M_string_length == 1,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x107,"1 == deps->node_count");
                                  pTVar1 = g_current_test;
                                  if (bVar2) {
                                    psVar8 = Node::path_abi_cxx11_
                                                       ((Node *)**(undefined8 **)
                                                                  &(other_out->path_).field_2);
                                    bVar2 = std::operator==("foo.h",psVar8);
                                    bVar2 = testing::Test::Check
                                                      (pTVar1,bVar2,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x108,"\"foo.h\" == deps->nodes[0]->path()");
                                    pNVar9 = local_7f8;
                                    pTVar1 = g_current_test;
                                    if (bVar2) {
                                      pvVar6 = DepsLog::nodes((DepsLog *)((long)&err_2.field_2 + 8))
                                      ;
                                      iVar3 = Node::id(local_7f8);
                                      ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::
                                                operator[](pvVar6,(long)iVar3);
                                      bVar2 = testing::Test::Check
                                                        (pTVar1,pNVar9 == *ppNVar7,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x109,"out == log.nodes()[out->id()]");
                                      if (bVar2) {
                                        other_out = (Node *)DepsLog::GetDeps((DepsLog *)
                                                                             ((long)&err_2.field_2 +
                                                                             8),local_818);
                                        bVar2 = testing::Test::Check
                                                          (g_current_test,other_out != (Node *)0x0,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x10c,"deps");
                                        if (bVar2) {
                                          bVar2 = testing::Test::Check
                                                            (g_current_test,
                                                             *(long *)&other_out->path_ == 1,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x10d,"1 == deps->mtime");
                                          if (bVar2) {
                                            bVar2 = testing::Test::Check
                                                              (g_current_test,
                                                               (int)(other_out->path_).
                                                                    _M_string_length == 2,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x10e,"2 == deps->node_count");
                                            pTVar1 = g_current_test;
                                            if (bVar2) {
                                              psVar8 = Node::path_abi_cxx11_
                                                                 ((Node *)**(undefined8 **)
                                                                            &(other_out->path_).
                                                                             field_2);
                                              bVar2 = std::operator==("foo.h",psVar8);
                                              bVar2 = testing::Test::Check
                                                                (pTVar1,bVar2,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x10f,"\"foo.h\" == deps->nodes[0]->path()");
                                              pTVar1 = g_current_test;
                                              if (bVar2) {
                                                psVar8 = Node::path_abi_cxx11_
                                                                   (*(Node **)((other_out->path_).
                                                                               field_2.
                                                  _M_allocated_capacity + 8));
                                                bVar2 = std::operator==("baz.h",psVar8);
                                                bVar2 = testing::Test::Check
                                                                  (pTVar1,bVar2,
                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x110,"\"baz.h\" == deps->nodes[1]->path()");
                                                pNVar9 = local_818;
                                                pTVar1 = g_current_test;
                                                if (bVar2) {
                                                  pvVar6 = DepsLog::nodes((DepsLog *)
                                                                          ((long)&err_2.field_2 + 8)
                                                                         );
                                                  iVar3 = Node::id(local_818);
                                                  ppNVar7 = std::
                                                  vector<Node_*,_std::allocator<Node_*>_>::
                                                  operator[](pvVar6,(long)iVar3);
                                                  bVar2 = testing::Test::Check
                                                                    (pTVar1,pNVar9 == *ppNVar7,
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x111,"other_out == log.nodes()[other_out->id()]"
                                                  );
                                                  pTVar1 = g_current_test;
                                                  if (bVar2) {
                                                    iVar3 = stat("DepsLogTest-tempfile",
                                                                 (stat *)&state_3.defaults_.
                                                                                                                                                    
                                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  bVar2 = testing::Test::Check
                                                                    (pTVar1,iVar3 == 0,
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x115,"0 == stat(kTestFilename, &st)");
                                                  if (bVar2) {
                                                    state_2.defaults_.
                                                                                                        
                                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_ = (int)st_2.st_rdev;
                                                  bVar2 = testing::Test::Check
                                                                    (g_current_test,
                                                                     (int)st_2.st_rdev <
                                                                     state_1.defaults_.
                                                                                                                                          
                                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x117,"file_size_3 < file_size_2");
                                                  if (bVar2) {
                                                    log.deps_.
                                                                                                        
                                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_ = 0;
                                                  }
                                                  else {
                                                    testing::Test::AddAssertionFailure
                                                              (g_current_test);
                                                    log.deps_.
                                                                                                        
                                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    testing::Test::AddAssertionFailure
                                                              (g_current_test);
                                                    log.deps_.
                                                                                                        
                                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    testing::Test::AddAssertionFailure
                                                              (g_current_test);
                                                    log.deps_.
                                                                                                        
                                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_ = 1;
                                                  }
                                                }
                                                else {
                                                  testing::Test::AddAssertionFailure(g_current_test)
                                                  ;
                                                  log.deps_.
                                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_ = 1;
                                                }
                                              }
                                              else {
                                                testing::Test::AddAssertionFailure(g_current_test);
                                                log.deps_.
                                                super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _0_4_ = 1;
                                              }
                                            }
                                            else {
                                              testing::Test::AddAssertionFailure(g_current_test);
                                              log.deps_.
                                              super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _0_4_ = 1;
                                            }
                                          }
                                          else {
                                            testing::Test::AddAssertionFailure(g_current_test);
                                            log.deps_.
                                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_
                                                 = 1;
                                          }
                                        }
                                        else {
                                          testing::Test::AddAssertionFailure(g_current_test);
                                          log.deps_.
                                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                                               1;
                                        }
                                      }
                                      else {
                                        testing::Test::AddAssertionFailure(g_current_test);
                                        log.deps_.
                                        super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1
                                        ;
                                      }
                                    }
                                    else {
                                      testing::Test::AddAssertionFailure(g_current_test);
                                      log.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                                    }
                                  }
                                  else {
                                    testing::Test::AddAssertionFailure(g_current_test);
                                    log.deps_.
                                    super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                                  }
                                }
                                else {
                                  testing::Test::AddAssertionFailure(g_current_test);
                                  log.deps_.
                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                                }
                              }
                              else {
                                testing::Test::AddAssertionFailure(g_current_test);
                                log.deps_.
                                super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                              }
                            }
                            else {
                              testing::Test::AddAssertionFailure(g_current_test);
                              log.deps_.
                              super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                            }
                          }
                          else {
                            testing::Test::AddAssertionFailure(g_current_test);
                            log.deps_.
                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                          }
                        }
                        else {
                          testing::Test::AddAssertionFailure(g_current_test);
                          log.deps_.
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                        }
                      }
                      else {
                        testing::Test::AddAssertionFailure(g_current_test);
                        log.deps_.
                        super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                      }
                    }
                    else {
                      testing::Test::AddAssertionFailure(g_current_test);
                      log.deps_.
                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                    }
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        std::__cxx11::string::~string((string *)local_7c8);
        DepsLog::~DepsLog((DepsLog *)((long)&err_2.field_2 + 8));
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      State::~State((State *)local_738);
      if ((int)log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
        State::State((State *)&log_3.deps_.
                               super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        DepsLog::DepsLog((DepsLog *)((long)&err_3.field_2 + 8));
        std::__cxx11::string::string((string *)local_a68);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a88,"DepsLogTest-tempfile",(allocator<char> *)((long)&out_1 + 7)
                  );
        LVar5 = DepsLog::Load((DepsLog *)((long)&err_3.field_2 + 8),&local_a88,
                              (State *)&log_3.deps_.
                                        super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (string *)local_a68);
        bVar2 = testing::Test::Check
                          (pTVar1,LVar5 != LOAD_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0x121,"log.Load(kTestFilename, &state, &err)");
        std::__cxx11::string::~string((string *)&local_a88);
        std::allocator<char>::~allocator((allocator<char> *)((long)&out_1 + 7));
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          StringPiece::StringPiece((StringPiece *)&deps_3,"out.o");
          local_a98 = State::GetNode((State *)&log_3.deps_.
                                               super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     _deps_3,0);
          other_out_1 = (Node *)DepsLog::GetDeps((DepsLog *)((long)&err_3.field_2 + 8),local_a98);
          bVar2 = testing::Test::Check
                            (g_current_test,other_out_1 != (Node *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0x125,"deps");
          if (bVar2) {
            bVar2 = testing::Test::Check
                              (g_current_test,*(long *)&other_out_1->path_ == 1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                               ,0x126,"1 == deps->mtime");
            if (bVar2) {
              bVar2 = testing::Test::Check
                                (g_current_test,(int)(other_out_1->path_)._M_string_length == 1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                 ,0x127,"1 == deps->node_count");
              pTVar1 = g_current_test;
              if (bVar2) {
                psVar8 = Node::path_abi_cxx11_
                                   ((Node *)**(undefined8 **)&(other_out_1->path_).field_2);
                bVar2 = std::operator==("foo.h",psVar8);
                bVar2 = testing::Test::Check
                                  (pTVar1,bVar2,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                   ,0x128,"\"foo.h\" == deps->nodes[0]->path()");
                if (bVar2) {
                  StringPiece::StringPiece(&local_ac8,"other_out.o");
                  local_ab8 = State::GetNode((State *)&log_3.deps_.
                                                                                                              
                                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             ,local_ac8,0);
                  other_out_1 = (Node *)DepsLog::GetDeps((DepsLog *)((long)&err_3.field_2 + 8),
                                                         local_ab8);
                  bVar2 = testing::Test::Check
                                    (g_current_test,other_out_1 != (Node *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                     ,300,"deps");
                  if (bVar2) {
                    bVar2 = testing::Test::Check
                                      (g_current_test,*(long *)&other_out_1->path_ == 1,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                       ,0x12d,"1 == deps->mtime");
                    if (bVar2) {
                      bVar2 = testing::Test::Check
                                        (g_current_test,
                                         (int)(other_out_1->path_)._M_string_length == 2,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                         ,0x12e,"2 == deps->node_count");
                      pTVar1 = g_current_test;
                      if (bVar2) {
                        psVar8 = Node::path_abi_cxx11_
                                           ((Node *)**(undefined8 **)&(other_out_1->path_).field_2);
                        bVar2 = std::operator==("foo.h",psVar8);
                        bVar2 = testing::Test::Check
                                          (pTVar1,bVar2,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                           ,0x12f,"\"foo.h\" == deps->nodes[0]->path()");
                        pTVar1 = g_current_test;
                        if (bVar2) {
                          psVar8 = Node::path_abi_cxx11_
                                             (*(Node **)((other_out_1->path_).field_2.
                                                         _M_allocated_capacity + 8));
                          bVar2 = std::operator==("baz.h",psVar8);
                          bVar2 = testing::Test::Check
                                            (pTVar1,bVar2,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                             ,0x130,"\"baz.h\" == deps->nodes[1]->path()");
                          pTVar1 = g_current_test;
                          if (bVar2) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_ae8,"DepsLogTest-tempfile",&local_ae9);
                            bVar2 = DepsLog::Recompact((DepsLog *)((long)&err_3.field_2 + 8),
                                                       &local_ae8,(string *)local_a68);
                            bVar2 = testing::Test::Check
                                              (pTVar1,bVar2,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                               ,0x132,"log.Recompact(kTestFilename, &err)");
                            std::__cxx11::string::~string((string *)&local_ae8);
                            std::allocator<char>::~allocator(&local_ae9);
                            if (((bVar2 ^ 0xffU) & 1) == 0) {
                              other_out_1 = (Node *)DepsLog::GetDeps((DepsLog *)
                                                                     ((long)&err_3.field_2 + 8),
                                                                     local_a98);
                              bVar2 = testing::Test::Check
                                                (g_current_test,other_out_1 == (Node *)0x0,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                 ,0x136,"deps");
                              if (bVar2) {
                                other_out_1 = (Node *)DepsLog::GetDeps((DepsLog *)
                                                                       ((long)&err_3.field_2 + 8),
                                                                       local_ab8);
                                bVar2 = testing::Test::Check
                                                  (g_current_test,other_out_1 == (Node *)0x0,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x139,"deps");
                                pTVar1 = g_current_test;
                                if (bVar2) {
                                  StringPiece::StringPiece(&local_b00,"foo.h");
                                  pNVar9 = State::LookupNode((State *)&log_3.deps_.
                                                                                                                                              
                                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,local_b00);
                                  iVar3 = Node::id(pNVar9);
                                  bVar2 = testing::Test::Check
                                                    (pTVar1,iVar3 == -1,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x13c,"-1 == state.LookupNode(\"foo.h\")->id()");
                                  pTVar1 = g_current_test;
                                  if (bVar2) {
                                    StringPiece::StringPiece
                                              ((StringPiece *)(st_3.__glibc_reserved + 2),"baz.h");
                                    pNVar9 = State::LookupNode((State *)&log_3.deps_.
                                                                                                                                                  
                                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,stack0xfffffffffffff4f0);
                                    iVar3 = Node::id(pNVar9);
                                    bVar2 = testing::Test::Check
                                                      (pTVar1,iVar3 == -1,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x13d,"-1 == state.LookupNode(\"baz.h\")->id()");
                                    pTVar1 = g_current_test;
                                    if (bVar2) {
                                      iVar3 = stat("DepsLogTest-tempfile",(stat *)local_ba0);
                                      bVar2 = testing::Test::Check
                                                        (pTVar1,iVar3 == 0,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x141,"0 == stat(kTestFilename, &st)");
                                      if (bVar2) {
                                        bVar2 = testing::Test::Check
                                                          (g_current_test,
                                                           (int)st_3.st_rdev <
                                                           state_2.defaults_.
                                                                                                                      
                                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                                  ,0x143,"file_size_4 < file_size_3");
                                        if (bVar2) {
                                          log.deps_.
                                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                                               0;
                                        }
                                        else {
                                          testing::Test::AddAssertionFailure(g_current_test);
                                          log.deps_.
                                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                                               1;
                                        }
                                      }
                                      else {
                                        testing::Test::AddAssertionFailure(g_current_test);
                                        log.deps_.
                                        super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1
                                        ;
                                      }
                                    }
                                    else {
                                      testing::Test::AddAssertionFailure(g_current_test);
                                      log.deps_.
                                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                                    }
                                  }
                                  else {
                                    testing::Test::AddAssertionFailure(g_current_test);
                                    log.deps_.
                                    super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                                  }
                                }
                                else {
                                  testing::Test::AddAssertionFailure(g_current_test);
                                  log.deps_.
                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                                }
                              }
                              else {
                                testing::Test::AddAssertionFailure(g_current_test);
                                log.deps_.
                                super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                              }
                            }
                            else {
                              testing::Test::AddAssertionFailure(g_current_test);
                              log.deps_.
                              super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                            }
                          }
                          else {
                            testing::Test::AddAssertionFailure(g_current_test);
                            log.deps_.
                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                          }
                        }
                        else {
                          testing::Test::AddAssertionFailure(g_current_test);
                          log.deps_.
                          super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                        }
                      }
                      else {
                        testing::Test::AddAssertionFailure(g_current_test);
                        log.deps_.
                        super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                      }
                    }
                    else {
                      testing::Test::AddAssertionFailure(g_current_test);
                      log.deps_.
                      super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                    }
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        std::__cxx11::string::~string((string *)local_a68);
        DepsLog::~DepsLog((DepsLog *)((long)&err_3.field_2 + 8));
        State::~State((State *)&log_3.deps_.
                                super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  return;
}

Assistant:

TEST_F(DepsLogTest, Recompact) {
  const char kManifest[] =
"rule cc\n"
"  command = cc\n"
"  deps = gcc\n"
"build out.o: cc\n"
"build other_out.o: cc\n";

  // Write some deps to the file and grab its size.
  int file_size;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("baz.h", 0));
    log.RecordDeps(state.GetNode("other_out.o", 0), 1, deps);

    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size = (int)st.st_size;
    ASSERT_GT(file_size, 0);
  }

  // Now reload the file, and add slightly different deps.
  int file_size_2;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    ASSERT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size_2 = (int)st.st_size;
    // The file should grow to record the new deps.
    ASSERT_GT(file_size_2, file_size);
  }

  // Now reload the file, verify the new deps have replaced the old, then
  // recompact.
  int file_size_3;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    Node* out = state.GetNode("out.o", 0);
    DepsLog::Deps* deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());

    Node* other_out = state.GetNode("other_out.o", 0);
    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());

    ASSERT_TRUE(log.Recompact(kTestFilename, &err));

    // The in-memory deps graph should still be valid after recompaction.
    deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ(out, log.nodes()[out->id()]);

    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());
    ASSERT_EQ(other_out, log.nodes()[other_out->id()]);

    // The file should have shrunk a bit for the smaller deps.
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size_3 = (int)st.st_size;
    ASSERT_LT(file_size_3, file_size_2);
  }

  // Now reload the file and recompact with an empty manifest. The previous
  // entries should be removed.
  {
    State state;
    // Intentionally not parsing kManifest here.
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    Node* out = state.GetNode("out.o", 0);
    DepsLog::Deps* deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());

    Node* other_out = state.GetNode("other_out.o", 0);
    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());

    ASSERT_TRUE(log.Recompact(kTestFilename, &err));

    // The previous entries should have been removed.
    deps = log.GetDeps(out);
    ASSERT_FALSE(deps);

    deps = log.GetDeps(other_out);
    ASSERT_FALSE(deps);

    // The .h files pulled in via deps should no longer have ids either.
    ASSERT_EQ(-1, state.LookupNode("foo.h")->id());
    ASSERT_EQ(-1, state.LookupNode("baz.h")->id());

    // The file should have shrunk more.
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    int file_size_4 = (int)st.st_size;
    ASSERT_LT(file_size_4, file_size_3);
  }
}